

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layout.cpp
# Opt level: O3

string * __thiscall
TextField::writeXml_abi_cxx11_(string *__return_storage_ptr__,TextField *this,int indent)

{
  int indent_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  char cVar3;
  string *psVar4;
  ostream *poVar5;
  stringstream str;
  string local_440;
  string *local_420;
  string local_418;
  string local_3f8;
  string local_3d8;
  string local_3b8;
  string local_398;
  string local_378;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_358;
  string local_338;
  string local_318;
  string local_2f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2d8;
  string local_2b8;
  string local_298;
  string local_278;
  string local_258;
  string local_238;
  string local_218;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f8;
  string local_1d8;
  stringstream local_1b8 [16];
  long local_1a8 [14];
  ios_base local_138 [264];
  
  std::__cxx11::stringstream::stringstream(local_1b8);
  Util::getIndent_abi_cxx11_(0);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)local_1a8,local_440._M_dataplus._M_p,local_440._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"<TextField",10);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_440._M_dataplus._M_p != &local_440.field_2) {
    operator_delete(local_440._M_dataplus._M_p);
  }
  Widget::writeXmlAttributes(&this->super_Widget,(stringstream *)local_1b8);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,">",1);
  cVar3 = (char)(ostream *)local_1a8;
  std::ios::widen((char)*(undefined8 *)(local_1a8[0] + -0x18) + cVar3);
  std::ostream::put(cVar3);
  std::ostream::flush();
  local_420 = __return_storage_ptr__;
  local_1d8._M_dataplus._M_p = (pointer)&local_1d8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1d8,"Text","");
  pcVar2 = (this->text)._M_dataplus._M_p;
  local_1f8._M_dataplus._M_p = (pointer)&local_1f8.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_1f8,pcVar2,pcVar2 + (this->text)._M_string_length);
  indent_00 = indent + 1;
  Util::writeXmlElement<std::__cxx11::string>
            ((stringstream *)local_1b8,indent_00,&local_1d8,&local_1f8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
    operator_delete(local_1f8._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
    operator_delete(local_1d8._M_dataplus._M_p);
  }
  local_218._M_dataplus._M_p = (pointer)&local_218.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_218,"TextColor","");
  Color::writeXml(&local_440,&this->textColor,indent_00,&local_218);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,local_440._M_dataplus._M_p,local_440._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_440._M_dataplus._M_p != &local_440.field_2) {
    operator_delete(local_440._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_218._M_dataplus._M_p != &local_218.field_2) {
    operator_delete(local_218._M_dataplus._M_p);
  }
  local_238._M_dataplus._M_p = (pointer)&local_238.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_238,"TextFontData","");
  FontData::writeXml(&local_440,&this->textFont,indent_00,&local_238);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,local_440._M_dataplus._M_p,local_440._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_440._M_dataplus._M_p != &local_440.field_2) {
    operator_delete(local_440._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_238._M_dataplus._M_p != &local_238.field_2) {
    operator_delete(local_238._M_dataplus._M_p);
  }
  local_258._M_dataplus._M_p = (pointer)&local_258.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_258,"InputMode","");
  Util::writeXmlElement<int>((stringstream *)local_1b8,indent_00,&local_258,this->textInputMode);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_258._M_dataplus._M_p != &local_258.field_2) {
    operator_delete(local_258._M_dataplus._M_p);
  }
  local_278._M_dataplus._M_p = (pointer)&local_278.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_278,"PasswordMode","");
  Util::writeXmlElement<bool>((stringstream *)local_1b8,indent_00,&local_278,this->passwordMode);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_278._M_dataplus._M_p != &local_278.field_2) {
    operator_delete(local_278._M_dataplus._M_p);
  }
  local_298._M_dataplus._M_p = (pointer)&local_298.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_298,"AcceptsReturn","");
  Util::writeXmlElement<bool>((stringstream *)local_1b8,indent_00,&local_298,this->acceptsReturn);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_298._M_dataplus._M_p != &local_298.field_2) {
    operator_delete(local_298._M_dataplus._M_p);
  }
  local_2b8._M_dataplus._M_p = (pointer)&local_2b8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2b8,"ImeWindowTitle","");
  pcVar2 = (this->imeWindowTitle)._M_dataplus._M_p;
  local_2d8._M_dataplus._M_p = (pointer)&local_2d8.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_2d8,pcVar2,pcVar2 + (this->imeWindowTitle)._M_string_length);
  Util::writeXmlElement<std::__cxx11::string>
            ((stringstream *)local_1b8,indent_00,&local_2b8,&local_2d8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2d8._M_dataplus._M_p != &local_2d8.field_2) {
    operator_delete(local_2d8._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2b8._M_dataplus._M_p != &local_2b8.field_2) {
    operator_delete(local_2b8._M_dataplus._M_p);
  }
  local_2f8._M_dataplus._M_p = (pointer)&local_2f8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2f8,"ImeEnterLabel","");
  Util::writeXmlElement<int>((stringstream *)local_1b8,indent_00,&local_2f8,this->imeEnterLabel);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2f8._M_dataplus._M_p != &local_2f8.field_2) {
    operator_delete(local_2f8._M_dataplus._M_p);
  }
  local_318._M_dataplus._M_p = (pointer)&local_318.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_318,"ImeWindowMode","");
  Util::writeXmlElement<int>((stringstream *)local_1b8,indent_00,&local_318,this->imeWindowMode);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_318._M_dataplus._M_p != &local_318.field_2) {
    operator_delete(local_318._M_dataplus._M_p);
  }
  local_338._M_dataplus._M_p = (pointer)&local_338.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_338,"Placeholder","");
  pcVar2 = (this->placeholder)._M_dataplus._M_p;
  local_358._M_dataplus._M_p = (pointer)&local_358.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_358,pcVar2,pcVar2 + (this->placeholder)._M_string_length);
  Util::writeXmlElement<std::__cxx11::string>
            ((stringstream *)local_1b8,indent_00,&local_338,&local_358);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_358._M_dataplus._M_p != &local_358.field_2) {
    operator_delete(local_358._M_dataplus._M_p);
  }
  paVar1 = &local_440.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_338._M_dataplus._M_p != &local_338.field_2) {
    operator_delete(local_338._M_dataplus._M_p);
  }
  local_378._M_dataplus._M_p = (pointer)&local_378.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_378,"PlaceHolderColor","");
  Color::writeXml(&local_440,&this->placeHolderColor,indent_00,&local_378);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,local_440._M_dataplus._M_p,local_440._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_440._M_dataplus._M_p != paVar1) {
    operator_delete(local_440._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_378._M_dataplus._M_p != &local_378.field_2) {
    operator_delete(local_378._M_dataplus._M_p);
  }
  local_398._M_dataplus._M_p = (pointer)&local_398.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_398,"PlaceholderFont","");
  FontData::writeXml(&local_440,&this->placeholderFont,indent_00,&local_398);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,local_440._M_dataplus._M_p,local_440._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_440._M_dataplus._M_p != paVar1) {
    operator_delete(local_440._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_398._M_dataplus._M_p != &local_398.field_2) {
    operator_delete(local_398._M_dataplus._M_p);
  }
  local_3b8._M_dataplus._M_p = (pointer)&local_3b8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3b8,"TextTrimming","");
  Util::writeXmlElement<TextTrimming>
            ((stringstream *)local_1b8,indent_00,&local_3b8,this->textTrimming);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3b8._M_dataplus._M_p != &local_3b8.field_2) {
    operator_delete(local_3b8._M_dataplus._M_p);
  }
  local_3d8._M_dataplus._M_p = (pointer)&local_3d8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3d8,"LineBreak","");
  Util::writeXmlElement<LineBreak>((stringstream *)local_1b8,indent_00,&local_3d8,this->lineBreak);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3d8._M_dataplus._M_p != &local_3d8.field_2) {
    operator_delete(local_3d8._M_dataplus._M_p);
  }
  local_3f8._M_dataplus._M_p = (pointer)&local_3f8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3f8,"HorizontalAlignment","");
  Util::writeXmlElement<HorizontalAlignment>
            ((stringstream *)local_1b8,indent_00,&local_3f8,this->horizontalAlignment);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3f8._M_dataplus._M_p != &local_3f8.field_2) {
    operator_delete(local_3f8._M_dataplus._M_p);
  }
  local_418._M_dataplus._M_p = (pointer)&local_418.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_418,"VerticalAlignment","");
  Util::writeXmlElement<VerticalAlignment>
            ((stringstream *)local_1b8,indent_00,&local_418,this->verticalAlignment);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_418._M_dataplus._M_p != &local_418.field_2) {
    operator_delete(local_418._M_dataplus._M_p);
  }
  Util::getIndent_abi_cxx11_(0);
  psVar4 = local_420;
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)local_1a8,local_440._M_dataplus._M_p,local_440._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"</TextField>",0xc);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_440._M_dataplus._M_p != paVar1) {
    operator_delete(local_440._M_dataplus._M_p);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1b8);
  std::ios_base::~ios_base(local_138);
  return psVar4;
}

Assistant:

std::string TextField::writeXml(int indent)
{
	std::stringstream str;
	str << Util::getIndent(indent) << "<TextField";
	writeXmlAttributes(str);
	str << ">" << std::endl;

	Util::writeXmlElement(str, indent + 1, "Text", text);
	str << textColor.writeXml(indent + 1, "TextColor");
	str << textFont.writeXml(indent + 1, "TextFontData");
	Util::writeXmlElement(str, indent + 1, "InputMode", textInputMode);
	Util::writeXmlElement(str, indent + 1, "PasswordMode", passwordMode);
	Util::writeXmlElement(str, indent + 1, "AcceptsReturn", acceptsReturn);
	Util::writeXmlElement(str, indent + 1, "ImeWindowTitle", imeWindowTitle);
	Util::writeXmlElement(str, indent + 1, "ImeEnterLabel", imeEnterLabel);
	Util::writeXmlElement(str, indent + 1, "ImeWindowMode", imeWindowMode);
	Util::writeXmlElement(str, indent + 1, "Placeholder", placeholder);
	str << placeHolderColor.writeXml(indent + 1, "PlaceHolderColor");
	str << placeholderFont.writeXml(indent + 1, "PlaceholderFont");
	Util::writeXmlElement(str, indent + 1, "TextTrimming", textTrimming);
	Util::writeXmlElement(str, indent + 1, "LineBreak", lineBreak);
	Util::writeXmlElement(str, indent + 1, "HorizontalAlignment", horizontalAlignment);
	Util::writeXmlElement(str, indent + 1, "VerticalAlignment", verticalAlignment);

	str << Util::getIndent(indent) << "</TextField>";

	return str.str();
}